

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
           *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__Proxy_Function_Base_0030ed08;
  pvVar1 = *(void **)&this->field_0x8;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x18 - (long)pvVar1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}